

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

int VP8LHashChainFill(VP8LHashChain *p,int quality,uint32_t *argb,int xsize,int ysize,int low_effort
                     )

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *__s;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint32_t uVar22;
  
  iVar18 = ysize * xsize;
  uVar4 = 0xfff88;
  if (quality < 0x4c) {
    if (quality < 0x33) {
      uVar4 = xsize << ((0x19 < quality) * '\x02' | 4U);
    }
    else {
      uVar4 = xsize << 8;
    }
  }
  uVar7 = 0xfff88;
  if ((int)uVar4 < 0xfff88) {
    uVar7 = uVar4;
  }
  puVar1 = p->offset_length_;
  if (iVar18 < 3) {
    puVar1[(long)iVar18 + -1] = 0;
    *puVar1 = 0;
  }
  else {
    __s = WebPSafeMalloc(0x40000,4);
    if (__s == (void *)0x0) {
      return 0;
    }
    uVar13 = (uint)(quality * quality) >> 7;
    iVar5 = uVar13 + 8;
    memset(__s,0xff,0x100000);
    uVar4 = iVar18 - 2;
    uVar19 = 0;
    bVar3 = *argb == argb[1];
    while ((int)uVar19 < (int)uVar4) {
      uVar22 = argb[(long)(int)uVar19 + 1];
      uVar15 = argb[(long)(int)uVar19 + 2];
      if ((bool)(bVar3 & uVar22 == uVar15)) {
        uVar15 = argb[(int)uVar19];
        uVar8 = 0xfffff002;
        uVar14 = 1;
        while ((uVar12 = uVar19 + uVar8 + 0x1001, (int)uVar12 < iVar18 && (argb[uVar12] == uVar15)))
        {
          uVar8 = uVar8 + 1;
          uVar14 = uVar14 + 1;
        }
        if (0xfff < uVar8 + 0xfff) {
          memset(puVar1 + (int)uVar19,0xff,(ulong)uVar8 << 2);
        }
        uVar8 = 0xfff;
        if (0xfff < uVar14) {
          uVar8 = uVar14;
        }
        iVar9 = uVar8 + uVar19 + -0xfff;
        uVar8 = 0xfff;
        if (uVar14 < 0xfff) {
          uVar8 = uVar14;
        }
        uVar12 = uVar15 * 0x5bd1e996 + uVar8 * -0x395b586d;
        uVar8 = uVar14;
        if (0xffe < uVar14) {
          uVar8 = 0xfff;
        }
        for (lVar17 = 0; uVar16 = (uint)lVar17, uVar8 != uVar16; lVar17 = lVar17 + 1) {
          puVar1[iVar9 + lVar17] = *(uint32_t *)((long)__s + (ulong)(uVar12 >> 0xe) * 4);
          *(uint *)((long)__s + (ulong)(uVar12 >> 0xe) * 4) = iVar9 + uVar16;
          uVar12 = uVar12 + 0x395b586d;
        }
        if (uVar14 < 0x1000) {
          uVar14 = 0xfff;
        }
        uVar19 = (uVar19 + uVar14 + uVar16) - 0xfff;
        bVar3 = false;
      }
      else {
        uVar11 = (ulong)(argb[(int)uVar19] * 0x5bd1e996 + uVar22 * -0x395b586d >> 0xe);
        puVar1[(int)uVar19] = *(uint32_t *)((long)__s + uVar11 * 4);
        *(uint *)((long)__s + uVar11 * 4) = uVar19;
        uVar19 = uVar19 + 1;
        bVar3 = uVar22 == uVar15;
      }
    }
    puVar1[uVar19] =
         *(uint32_t *)
          ((long)__s +
          (ulong)(argb[uVar19] * 0x5bd1e996 + argb[(ulong)uVar19 + 1] * -0x395b586d >> 0xe) * 4);
    WebPSafeFree(__s);
    puVar2 = p->offset_length_;
    puVar2[iVar18 - 1U] = 0;
    *puVar2 = 0;
    iVar9 = uVar13 + 7;
    while (uVar11 = (ulong)uVar4, uVar4 != 0) {
      iVar10 = (iVar18 - 1U) - uVar4;
      iVar6 = 0xfff;
      if (iVar10 < 0xfff) {
        iVar6 = iVar10;
      }
      uVar19 = 0;
      uVar13 = uVar4 - uVar7;
      if (uVar4 < uVar7) {
        uVar13 = uVar19;
      }
      if (0xff < iVar10) {
        iVar10 = 0x100;
      }
      puVar2 = argb + uVar11;
      uVar15 = puVar1[uVar11];
      if (low_effort == 0) {
        uVar8 = 0;
        uVar20 = 0;
        iVar21 = iVar5;
        uVar14 = 0;
        if (((uint)xsize <= uVar4) &&
           (uVar20 = 0, iVar21 = iVar9, puVar2[-(ulong)(uint)xsize] == *puVar2)) {
          uVar19 = (*VP8LVectorMismatch)(puVar2 + -(ulong)(uint)xsize,puVar2,iVar6);
          uVar20 = (ulong)uVar19;
          if ((int)uVar19 < 1) {
            uVar20 = 0;
          }
          uVar14 = 0;
          if (0 < (int)uVar19) {
            uVar14 = xsize;
          }
        }
        if (puVar2[uVar20 - 1] == puVar2[uVar20]) {
          uVar8 = (*VP8LVectorMismatch)(puVar2 + -1,puVar2,iVar6);
        }
        uVar19 = (uint)uVar20;
        if ((int)(uint)uVar20 < (int)uVar8) {
          uVar14 = 1;
          uVar19 = uVar8;
        }
        iVar21 = iVar21 + -1;
        if (uVar19 == 0xfff) {
          uVar15 = uVar13 - 1;
        }
      }
      else {
        uVar14 = 0;
        iVar21 = iVar5;
      }
      uVar22 = puVar2[uVar19];
      while ((iVar21 = iVar21 + -1, (int)uVar13 <= (int)uVar15 && (iVar21 != 0))) {
        if ((argb[(int)(uVar19 + uVar15)] == uVar22) &&
           (uVar8 = (*VP8LVectorMismatch)(argb + (int)uVar15,puVar2,iVar6), (int)uVar19 < (int)uVar8
           )) {
          uVar14 = uVar4 - uVar15;
          uVar19 = uVar8;
          if (iVar10 <= (int)uVar8) break;
          uVar22 = puVar2[uVar8];
        }
        uVar15 = puVar1[(int)uVar15];
      }
      puVar2 = p->offset_length_;
      uVar13 = uVar4;
      while( true ) {
        uVar4 = uVar13 - 1;
        puVar2[uVar13] = uVar19 | uVar14 << 0xc;
        if ((((uVar14 == 0) || (uVar4 == 0)) || (uVar4 < uVar14)) ||
           ((argb[uVar4 - uVar14] != argb[uVar4] ||
            (((uVar14 != 1 && (uVar19 == 0xfff)) && (uVar13 + 0xffe < (uint)uVar11)))))) break;
        if ((int)uVar19 < 0xfff) {
          uVar11 = (ulong)uVar4;
        }
        uVar19 = uVar19 + ((int)uVar19 < 0xfff);
        uVar13 = uVar4;
      }
    }
  }
  return 1;
}

Assistant:

int VP8LHashChainFill(VP8LHashChain* const p, int quality,
                      const uint32_t* const argb, int xsize, int ysize,
                      int low_effort) {
  const int size = xsize * ysize;
  const int iter_max = GetMaxItersForQuality(quality);
  const uint32_t window_size = GetWindowSizeForHashChain(quality, xsize);
  int pos;
  int argb_comp;
  uint32_t base_position;
  int32_t* hash_to_first_index;
  // Temporarily use the p->offset_length_ as a hash chain.
  int32_t* chain = (int32_t*)p->offset_length_;
  assert(size > 0);
  assert(p->size_ != 0);
  assert(p->offset_length_ != NULL);

  if (size <= 2) {
    p->offset_length_[0] = p->offset_length_[size - 1] = 0;
    return 1;
  }

  hash_to_first_index =
      (int32_t*)WebPSafeMalloc(HASH_SIZE, sizeof(*hash_to_first_index));
  if (hash_to_first_index == NULL) return 0;

  // Set the int32_t array to -1.
  memset(hash_to_first_index, 0xff, HASH_SIZE * sizeof(*hash_to_first_index));
  // Fill the chain linking pixels with the same hash.
  argb_comp = (argb[0] == argb[1]);
  for (pos = 0; pos < size - 2;) {
    uint32_t hash_code;
    const int argb_comp_next = (argb[pos + 1] == argb[pos + 2]);
    if (argb_comp && argb_comp_next) {
      // Consecutive pixels with the same color will share the same hash.
      // We therefore use a different hash: the color and its repetition
      // length.
      uint32_t tmp[2];
      uint32_t len = 1;
      tmp[0] = argb[pos];
      // Figure out how far the pixels are the same.
      // The last pixel has a different 64 bit hash, as its next pixel does
      // not have the same color, so we just need to get to the last pixel equal
      // to its follower.
      while (pos + (int)len + 2 < size && argb[pos + len + 2] == argb[pos]) {
        ++len;
      }
      if (len > MAX_LENGTH) {
        // Skip the pixels that match for distance=1 and length>MAX_LENGTH
        // because they are linked to their predecessor and we automatically
        // check that in the main for loop below. Skipping means setting no
        // predecessor in the chain, hence -1.
        memset(chain + pos, 0xff, (len - MAX_LENGTH) * sizeof(*chain));
        pos += len - MAX_LENGTH;
        len = MAX_LENGTH;
      }
      // Process the rest of the hash chain.
      while (len) {
        tmp[1] = len--;
        hash_code = GetPixPairHash64(tmp);
        chain[pos] = hash_to_first_index[hash_code];
        hash_to_first_index[hash_code] = pos++;
      }
      argb_comp = 0;
    } else {
      // Just move one pixel forward.
      hash_code = GetPixPairHash64(argb + pos);
      chain[pos] = hash_to_first_index[hash_code];
      hash_to_first_index[hash_code] = pos++;
      argb_comp = argb_comp_next;
    }
  }
  // Process the penultimate pixel.
  chain[pos] = hash_to_first_index[GetPixPairHash64(argb + pos)];

  WebPSafeFree(hash_to_first_index);

  // Find the best match interval at each pixel, defined by an offset to the
  // pixel and a length. The right-most pixel cannot match anything to the right
  // (hence a best length of 0) and the left-most pixel nothing to the left
  // (hence an offset of 0).
  assert(size > 2);
  p->offset_length_[0] = p->offset_length_[size - 1] = 0;
  for (base_position = size - 2; base_position > 0;) {
    const int max_len = MaxFindCopyLength(size - 1 - base_position);
    const uint32_t* const argb_start = argb + base_position;
    int iter = iter_max;
    int best_length = 0;
    uint32_t best_distance = 0;
    uint32_t best_argb;
    const int min_pos =
        (base_position > window_size) ? base_position - window_size : 0;
    const int length_max = (max_len < 256) ? max_len : 256;
    uint32_t max_base_position;

    pos = chain[base_position];
    if (!low_effort) {
      int curr_length;
      // Heuristic: use the comparison with the above line as an initialization.
      if (base_position >= (uint32_t)xsize) {
        curr_length = FindMatchLength(argb_start - xsize, argb_start,
                                      best_length, max_len);
        if (curr_length > best_length) {
          best_length = curr_length;
          best_distance = xsize;
        }
        --iter;
      }
      // Heuristic: compare to the previous pixel.
      curr_length =
          FindMatchLength(argb_start - 1, argb_start, best_length, max_len);
      if (curr_length > best_length) {
        best_length = curr_length;
        best_distance = 1;
      }
      --iter;
      // Skip the for loop if we already have the maximum.
      if (best_length == MAX_LENGTH) pos = min_pos - 1;
    }
    best_argb = argb_start[best_length];

    for (; pos >= min_pos && --iter; pos = chain[pos]) {
      int curr_length;
      assert(base_position > (uint32_t)pos);

      if (argb[pos + best_length] != best_argb) continue;

      curr_length = VP8LVectorMismatch(argb + pos, argb_start, max_len);
      if (best_length < curr_length) {
        best_length = curr_length;
        best_distance = base_position - pos;
        best_argb = argb_start[best_length];
        // Stop if we have reached a good enough length.
        if (best_length >= length_max) break;
      }
    }
    // We have the best match but in case the two intervals continue matching
    // to the left, we have the best matches for the left-extended pixels.
    max_base_position = base_position;
    while (1) {
      assert(best_length <= MAX_LENGTH);
      assert(best_distance <= WINDOW_SIZE);
      p->offset_length_[base_position] =
          (best_distance << MAX_LENGTH_BITS) | (uint32_t)best_length;
      --base_position;
      // Stop if we don't have a match or if we are out of bounds.
      if (best_distance == 0 || base_position == 0) break;
      // Stop if we cannot extend the matching intervals to the left.
      if (base_position < best_distance ||
          argb[base_position - best_distance] != argb[base_position]) {
        break;
      }
      // Stop if we are matching at its limit because there could be a closer
      // matching interval with the same maximum length. Then again, if the
      // matching interval is as close as possible (best_distance == 1), we will
      // never find anything better so let's continue.
      if (best_length == MAX_LENGTH && best_distance != 1 &&
          base_position + MAX_LENGTH < max_base_position) {
        break;
      }
      if (best_length < MAX_LENGTH) {
        ++best_length;
        max_base_position = base_position;
      }
    }
  }
  return 1;
}